

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

Acb_Man_t *
Acb_ManAlloc(char *pFileName,int nNtks,Abc_Nam_t *pStrs,Abc_Nam_t *pFuns,Abc_Nam_t *pMods,
            Hash_IntMan_t *vHash)

{
  uint nSize;
  ulong uVar1;
  uint uVar2;
  Acb_Man_t *pAVar3;
  char *pcVar4;
  size_t sVar5;
  Abc_Nam_t *pAVar6;
  Abc_Nam_t *pAVar7;
  Hash_IntMan_t *pHVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  undefined4 in_register_00000034;
  ulong uVar11;
  uint uVar12;
  
  pAVar6 = (Abc_Nam_t *)CONCAT44(in_register_00000034,nNtks);
  pAVar3 = (Acb_Man_t *)calloc(1,0x6e8);
  pcVar4 = Extra_FileDesignName(pFileName);
  pAVar3->pName = pcVar4;
  if (pFileName == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pFileName);
    pcVar4 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar4,pFileName);
  }
  pAVar3->pSpec = pcVar4;
  if (pAVar6 == (Abc_Nam_t *)0x0) {
    pAVar6 = Abc_NamStart(1000,0x18);
  }
  pAVar3->pStrs = pAVar6;
  pAVar6 = Abc_NamStart(100,0x18);
  pAVar3->pFuns = pAVar6;
  pAVar7 = Abc_NamStart(100,0x18);
  pAVar3->pMods = pAVar7;
  pHVar8 = (Hash_IntMan_t *)calloc(1,0x18);
  uVar12 = 1099;
  do {
    do {
      nSize = uVar12 + 1;
      uVar2 = uVar12 & 1;
      uVar12 = nSize;
    } while (uVar2 != 0);
    uVar11 = 3;
    do {
      iVar10 = (int)uVar11;
      if (nSize < (uint)(iVar10 * iVar10)) {
        pVVar9 = Vec_IntStart(nSize);
        pHVar8->vTable = pVVar9;
        pVVar9 = Vec_IntAlloc(0x1130);
        pHVar8->vObjs = pVVar9;
        Vec_IntFill(pVVar9,4,0);
        pHVar8->nRefs = 1;
        pAVar3->vHash = pHVar8;
        Abc_NamStrFindOrAdd(pAVar6,"1\'b0",(int *)0x0);
        Abc_NamStrFindOrAdd(pAVar6,"1\'b1",(int *)0x0);
        Abc_NamStrFindOrAdd(pAVar6,"1\'bx",(int *)0x0);
        Abc_NamStrFindOrAdd(pAVar6,"1\'bz",(int *)0x0);
        Vec_PtrGrow(&pAVar3->vNtks,2);
        Vec_PtrPush(&pAVar3->vNtks,(void *)0x0);
        pAVar3->iRoot = 1;
        return pAVar3;
      }
      uVar1 = (ulong)nSize % uVar11;
      uVar11 = (ulong)(iVar10 + 2);
    } while ((int)uVar1 != 0);
  } while( true );
}

Assistant:

static inline Acb_Man_t * Acb_ManAlloc( char * pFileName, int nNtks, Abc_Nam_t * pStrs, Abc_Nam_t * pFuns, Abc_Nam_t * pMods, Hash_IntMan_t * vHash )
{
    Acb_Man_t * pNew = ABC_CALLOC( Acb_Man_t, 1 );
    pNew->pName = Extra_FileDesignName( pFileName );
    pNew->pSpec = Abc_UtilStrsav( pFileName );
    pNew->pStrs = pStrs ? pStrs : Abc_NamStart( 1000, 24 );
    pNew->pFuns = pFuns ? pFuns : Abc_NamStart( 100, 24 );
    pNew->pMods = pMods ? pMods : Abc_NamStart( 100, 24 );
    pNew->vHash = vHash ? vHash : Hash_IntManStart( 1000 );
    if ( pFuns == NULL )
    {
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b0", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b1", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bx", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bz", NULL);
    }
//    if ( vHash == NULL )
//        Hash_Int2ManInsert( pNew->vHash, 0, 0, 0 );
    Vec_PtrGrow( &pNew->vNtks,  nNtks+1 ); Vec_PtrPush( &pNew->vNtks, NULL );
    // set default root module
    pNew->iRoot = 1;
    return pNew;
}